

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

void __thiscall HDual::rp_hsol_da_str(HDual *this)

{
  uint uVar1;
  long lVar2;
  
  printf("\nIteration %d\n",(ulong)(uint)this->model->numberIteration);
  if (0x14 < this->numTot) {
    return;
  }
  puts("\nData structures");
  printf("         ");
  if (0 < this->numTot) {
    uVar1 = 0;
    do {
      printf(" %4d",(ulong)uVar1);
      uVar1 = uVar1 + 1;
    } while ((int)uVar1 < this->numTot);
  }
  putchar(10);
  printf("NonBcFg: ");
  if (0 < this->numTot) {
    lVar2 = 0;
    do {
      printf(" %4d",(ulong)(uint)(this->model->nonbasicFlag).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numTot);
  }
  putchar(10);
  printf("WorkMv:  ");
  if (0 < this->numTot) {
    lVar2 = 0;
    do {
      printf(" %4d",(ulong)(uint)(this->model->nonbasicMove).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numTot);
  }
  putchar(10);
  printf("DvxIx:   ");
  if (0 < this->numTot) {
    lVar2 = 0;
    do {
      printf(" %4d",(ulong)(uint)(this->dvx_ix).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numTot);
  }
  putchar(10);
  printf("BcIx:    ");
  if (0 < this->numRow) {
    lVar2 = 0;
    do {
      printf(" %4d",(ulong)(uint)(this->model->basicIndex).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numRow);
  }
  putchar(10);
  printf("DvxV:    ");
  if (0 < this->numRow) {
    lVar2 = 0;
    do {
      printf(" %4.1g",(this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numRow);
  }
  putchar(10);
  return;
}

Assistant:

void HDual::rp_hsol_da_str() {

	printf("\nIteration %d\n", model->numberIteration);
	if (numTot > mx_rp_numTot)
		return;

	printf("\nData structures\n");
	printf("         ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", i);
	}
	printf("\n");

	printf("NonBcFg: ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", model->getNonbasicFlag()[i]);
	}
	printf("\n");

	printf("WorkMv:  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", model->getNonbasicMove()[i]);
	}
	printf("\n");

	printf("DvxIx:   ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", dvx_ix[i]);
	}
	printf("\n");

	printf("BcIx:    ");
	for (int i = 0; i < numRow; i++) {
		printf(" %4d", model->getBaseIndex()[i]);
	}
	printf("\n");

	printf("DvxV:    ");
	for (int i = 0; i < numRow; i++) {
		printf(" %4.1g", dualRHS.workEdWt[i]);
	}
	printf("\n");
}